

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

void get_2d_neighbors(int i,int nx,int ny,int *left,int *right,int *lower,int *upper)

{
  int iVar1;
  int iVar2;
  int iy;
  int ix;
  int *lower_local;
  int *right_local;
  int *left_local;
  int ny_local;
  int nx_local;
  int i_local;
  
  iVar2 = i % nx;
  iVar1 = (i - iVar2) / nx;
  if (iVar2 == 0) {
    *left = -1;
  }
  else {
    *left = i + -1;
  }
  if (iVar2 == nx + -1) {
    *right = -1;
  }
  else {
    *right = i + 1;
  }
  if (iVar1 == 0) {
    *lower = -1;
  }
  else {
    *lower = i - nx;
  }
  if (iVar1 == ny + -1) {
    *upper = -1;
  }
  else {
    *upper = i + nx;
  }
  return;
}

Assistant:

void get_2d_neighbors(int i, int nx, int ny, int& left, int& right, int& lower, int& upper) {
    int ix, iy;
    ix = i % nx;
    iy = (i - ix) / nx;

    if (ix == 0)      left  = -1;
    else              left  = i - 1;
    if (ix == nx - 1) right = -1;
    else              right = i + 1;
    if (iy == 0)      lower = -1;
    else              lower = i - nx;
    if (iy == ny - 1) upper = -1;
    else              upper = i + nx;
}